

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

stack<int,_std::deque<int,_std::allocator<int>_>_> * __thiscall
CP::stack<int>::remove_top
          (stack<int,_std::deque<int,_std::allocator<int>_>_> *__return_storage_ptr__,
          stack<int> *this,size_t K)

{
  int *__x;
  size_t sVar1;
  value_type *__x_00;
  size_t i;
  ulong uVar2;
  vector<int,_std::allocator<int>_> v;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  sVar1 = this->mSize;
  uVar2 = 0;
  while ((uVar2 < K && (sVar1 != 0))) {
    __x = top(this);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_48,__x);
    sVar1 = this->mSize - 1;
    this->mSize = sVar1;
    uVar2 = uVar2 + 1;
  }
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(__return_storage_ptr__);
  __x_00 = local_48._M_impl.super__Vector_impl_data._M_finish;
  if (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    while (__x_00 = __x_00 + -1, local_48._M_impl.super__Vector_impl_data._M_start <= __x_00) {
      std::deque<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->c,__x_00);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::stack<T> CP::stack<T>::remove_top(size_t K) {
  //write your code here
  //
  //don't forget to return an std::stack
  std::vector<T> v;
  for (size_t i = 0; i < K; ++i) {
    if (mSize == 0) break;
    v.push_back(top());
    mSize--;
  }
  std::stack<T> s;
  if (v.empty()) return s;
  for (auto it = v.end() - 1; it >= v.begin(); --it) {
    s.push(*it);
  }
  return s;
}